

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::ConfidentialTransaction
          (ConfidentialTransaction *this,int32_t version,uint32_t lock_time)

{
  CfdException *this_00;
  allocator local_4d;
  int ret;
  wally_tx *tx_pointer;
  undefined1 local_40 [32];
  
  AbstractTransaction::AbstractTransaction(&this->super_AbstractTransaction);
  (this->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__ConfidentialTransaction_00654a88;
  (this->vin_).
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vin_).
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vin_).
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vout_).
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vout_).
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vout_).
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tx_pointer = (wally_tx *)0x0;
  ret = wally_tx_init_alloc(version,lock_time,0,0,&tx_pointer);
  if (ret == 0) {
    (this->super_AbstractTransaction).wally_tx_pointer_ = tx_pointer;
    return;
  }
  local_40._0_8_ = "cfdcore_elements_transaction.cpp";
  local_40._8_4_ = 0x4f6;
  local_40._16_8_ = "ConfidentialTransaction";
  logger::warn<int&>((CfdSourceLocation *)local_40,"wally_tx_init_alloc NG[{}] ",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"transaction data generate error.",&local_4d);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ConfidentialTransaction::ConfidentialTransaction(
    int32_t version, uint32_t lock_time)
    : vin_(), vout_() {
  struct wally_tx *tx_pointer = NULL;
  int ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "transaction data generate error.");
  }
  wally_tx_pointer_ = tx_pointer;
}